

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::CheckMax
          (ShaderImageLoadStoreBase *this,GLenum pname,GLint min_value)

{
  int local_40 [2];
  GLint64 i64;
  GLdouble d;
  int local_28;
  GLfloat f;
  GLint i;
  GLenum GStack_1c;
  GLboolean b;
  GLint min_value_local;
  GLenum pname_local;
  ShaderImageLoadStoreBase *this_local;
  
  i = min_value;
  GStack_1c = pname;
  _min_value_local = this;
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,pname,&local_28);
  if (local_28 < i) {
    this_local._7_1_ = false;
  }
  else {
    glu::CallLogWrapper::glGetBooleanv
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GStack_1c,
               (GLboolean *)((long)&f + 3));
    if ((bool)f._3_1_ == (local_28 != 0)) {
      glu::CallLogWrapper::glGetFloatv
                (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GStack_1c,
                 (GLfloat *)((long)&d + 4));
      if ((int)d._4_4_ < i) {
        this_local._7_1_ = false;
      }
      else {
        glu::CallLogWrapper::glGetDoublev
                  (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GStack_1c,
                   (GLdouble *)&i64);
        if ((int)(double)i64 < i) {
          this_local._7_1_ = false;
        }
        else {
          glu::CallLogWrapper::glGetInteger64v
                    (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,GStack_1c,
                     (GLint64 *)local_40);
          if (local_40[0] < i) {
            this_local._7_1_ = false;
          }
          else {
            this_local._7_1_ = true;
          }
        }
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool CheckMax(GLenum pname, GLint min_value)
	{
		GLboolean b;
		GLint	 i;
		GLfloat   f;
		GLdouble  d;
		GLint64   i64;

		glGetIntegerv(pname, &i);
		if (i < min_value)
			return false;

		glGetBooleanv(pname, &b);
		if (b != (i ? GL_TRUE : GL_FALSE))
			return false;

		glGetFloatv(pname, &f);
		if (static_cast<GLint>(f) < min_value)
			return false;

		glGetDoublev(pname, &d);
		if (static_cast<GLint>(d) < min_value)
			return false;

		glGetInteger64v(pname, &i64);
		if (static_cast<GLint>(i64) < min_value)
			return false;

		return true;
	}